

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::resize
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,size_type n)

{
  polymorphic_allocator<pbrt::Half> *ppVar1;
  polymorphic_allocator<pbrt::Half> *ppVar2;
  polymorphic_allocator<pbrt::Half> *ppVar3;
  polymorphic_allocator<pbrt::Half> *in_RSI;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RDI;
  size_t i_1;
  size_t i;
  Half *in_stack_ffffffffffffffb8;
  polymorphic_allocator<pbrt::Half> *in_stack_ffffffffffffffc0;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_stack_ffffffffffffffe0;
  polymorphic_allocator<pbrt::Half> *local_18;
  
  ppVar2 = in_RSI;
  ppVar1 = (polymorphic_allocator<pbrt::Half> *)size(in_RDI);
  local_18 = in_RSI;
  if (ppVar2 < ppVar1) {
    for (; ppVar2 = (polymorphic_allocator<pbrt::Half> *)size(in_RDI), local_18 < ppVar2;
        local_18 = (polymorphic_allocator<pbrt::Half> *)((long)&local_18->memoryResource + 1)) {
      pmr::polymorphic_allocator<pbrt::Half>::destroy<pbrt::Half>
                (&in_RDI->alloc,in_RDI->ptr + (long)local_18);
    }
    if (in_RSI == (polymorphic_allocator<pbrt::Half> *)0x0) {
      pmr::polymorphic_allocator<pbrt::Half>::deallocate_object<pbrt::Half>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x88a136);
      in_RDI->ptr = (Half *)0x0;
      in_RDI->nAlloc = 0;
    }
  }
  else {
    ppVar1 = in_RSI;
    ppVar3 = (polymorphic_allocator<pbrt::Half> *)size(in_RDI);
    if (ppVar3 < ppVar1) {
      reserve(in_stack_ffffffffffffffe0,(size_t)ppVar2);
      for (ppVar2 = (polymorphic_allocator<pbrt::Half> *)in_RDI->nStored; ppVar2 < in_RSI;
          ppVar2 = (polymorphic_allocator<pbrt::Half> *)((long)&ppVar2->memoryResource + 1)) {
        pmr::polymorphic_allocator<pbrt::Half>::construct<pbrt::Half>
                  (ppVar1,in_stack_ffffffffffffffb8);
      }
    }
  }
  in_RDI->nStored = (size_t)in_RSI;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }